

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Point3f __thiscall pbrt::detail::Hammersley3DIter::operator*(Hammersley3DIter *this)

{
  Tuple3<pbrt::Point3,_float> TVar1;
  int *in_RDI;
  float fVar2;
  Float FVar3;
  int unaff_retaddr;
  undefined4 local_c;
  undefined4 in_stack_fffffffffffffff8;
  float in_stack_fffffffffffffffc;
  
  fVar2 = (float)*in_RDI / (float)in_RDI[1];
  FVar3 = RadicalInverse(unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                        );
  RadicalInverse(unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(fVar2,FVar3),(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),
             0.0);
  TVar1.y = (float)in_stack_fffffffffffffff8;
  TVar1.x = (float)local_c;
  TVar1.z = in_stack_fffffffffffffffc;
  return (Point3f)TVar1;
}

Assistant:

PBRT_CPU_GPU
    Point3f operator*() {
        return {Float(i) / Float(n), RadicalInverse(0, i), RadicalInverse(1, i)};
    }